

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O0

void __thiscall
glu::Texture3D::Texture3D
          (Texture3D *this,RenderContext *context,deUint32 format,deUint32 dataType,int width,
          int height,int depth)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  Functions *gl;
  int local_28;
  int local_24;
  int height_local;
  int width_local;
  deUint32 dataType_local;
  deUint32 format_local;
  RenderContext *context_local;
  Texture3D *this_local;
  
  this->m_context = context;
  this->m_isCompressed = false;
  this->m_format = format;
  local_28 = height;
  local_24 = width;
  height_local = dataType;
  width_local = format;
  _dataType_local = context;
  context_local = (RenderContext *)this;
  gl = (Functions *)mapGLTransferFormat(format,dataType);
  tcu::Texture3D::Texture3D(&this->m_refTexture,(TextureFormat *)&gl,local_24,local_28,depth);
  this->m_glTexture = 0;
  iVar1 = (*this->m_context->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x6f8))(1,&this->m_glTexture);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  checkError(err,"glGenTextures() failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x28f);
  return;
}

Assistant:

Texture3D::Texture3D (const RenderContext& context, deUint32 format, deUint32 dataType, int width, int height, int depth)
	: m_context			(context)
	, m_isCompressed	(false)
	, m_format			(format)
	, m_refTexture		(mapGLTransferFormat(format, dataType), width, height, depth)
	, m_glTexture		(0)
{
	// \todo [2013-04-08 pyry] Check support here.
	const glw::Functions& gl = m_context.getFunctions();
	gl.genTextures(1, &m_glTexture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() failed");
}